

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

char * get_string_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  char *pcVar1;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (should_free != 0) {
      json_decref(root);
    }
    *result = 0;
  }
  else {
    if (json->type == JSON_STRING) {
      pcVar1 = json_string_value(json);
      pcVar1 = strdup(pcVar1);
      *result = 1;
      if (should_free == 0) {
        return pcVar1;
      }
      json_decref(root);
      return pcVar1;
    }
    *result = -1;
    fprintf(_stderr,"error: option item %s is expected to be a string\n",option_name);
    if (should_free == 0) {
      return (char *)0x0;
    }
    json_decref(root);
  }
  return (char *)0x0;
}

Assistant:

static char * get_string_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	char * option_value;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return NULL;
	}

	if (!json_is_string(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be a string\n", option_name);
		if (should_free)
			json_decref(root);
		return NULL;
	}

	option_value = strdup(json_string_value(option_item));
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}